

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

IrRef ir_load_const(Trace *trace,int const_idx)

{
  IrIns ins_00;
  IrRef load;
  IrIns ins;
  int const_idx_local;
  Trace *trace_local;
  
  if (trace->const_loads[const_idx] == 0) {
    ins_00 = ir_new1(IR_LOAD_CONST,const_idx);
    trace_local._6_2_ = ir_emit(trace,ins_00);
    trace->const_loads[const_idx] = trace_local._6_2_;
  }
  else {
    trace_local._6_2_ = trace->const_loads[const_idx];
  }
  return trace_local._6_2_;
}

Assistant:

static IrRef ir_load_const(Trace *trace, int const_idx) {
	if (trace->const_loads[const_idx] == IR_NONE) {
		// Emit a load constant instruction
		IrIns ins = ir_new1(IR_LOAD_CONST, (uint32_t) const_idx);
		IrRef load = ir_emit(trace, ins);
		trace->const_loads[const_idx] = load;
		return load;
	} else {
		// Return the index of the constant load instruction
		return trace->const_loads[const_idx];
	}
}